

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall icu_63::RBBITableBuilder::removeState(RBBITableBuilder *this,IntPair duplStates)

{
  UVector32 *this_00;
  uint uVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  RBBIStateDescriptor *this_01;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int index;
  ulong uVar8;
  int index_00;
  void *pvVar9;
  
  pvVar9 = (void *)((ulong)duplStates >> 0x20);
  index_00 = duplStates.second;
  this_01 = (RBBIStateDescriptor *)UVector::elementAt(this->fDStates,index_00);
  UVector::removeElementAt(this->fDStates,index_00);
  if (this_01 != (RBBIStateDescriptor *)0x0) {
    RBBIStateDescriptor::~RBBIStateDescriptor(this_01);
  }
  UMemory::operator_delete((UMemory *)this_01,pvVar9);
  iVar5 = this->fDStates->count;
  uVar1 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  uVar8 = 0;
  uVar7 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar7 = uVar8;
  }
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  do {
    index = (int)uVar8;
    if (index == iVar5) {
      return;
    }
    pvVar9 = UVector::elementAt(this->fDStates,index);
    for (uVar8 = 0; iVar4 = duplStates.first, uVar7 != uVar8; uVar8 = uVar8 + 1) {
      this_00 = *(UVector32 **)((long)pvVar9 + 0x28);
      iVar2 = 0;
      if ((long)uVar8 < (long)this_00->count) {
        iVar2 = this_00->elements[uVar8];
      }
      iVar6 = iVar2 - (uint)(index_00 < iVar2);
      if (iVar2 == index_00) {
        iVar6 = iVar4;
      }
      UVector32::setElementAt(this_00,iVar6,(int32_t)uVar8);
    }
    iVar6 = *(int *)((long)pvVar9 + 4);
    iVar3 = iVar4;
    if (iVar6 == index_00) {
LAB_00294653:
      *(int *)((long)pvVar9 + 4) = iVar3;
    }
    else if (index_00 < iVar6) {
      iVar3 = iVar6 + -1;
      goto LAB_00294653;
    }
    iVar6 = *(int *)((long)pvVar9 + 8);
    if (iVar6 == index_00) {
LAB_00294666:
      *(int *)((long)pvVar9 + 8) = iVar4;
    }
    else if (index_00 < iVar6) {
      iVar4 = iVar6 + -1;
      goto LAB_00294666;
    }
    uVar8 = (ulong)(index + 1);
  } while( true );
}

Assistant:

void RBBITableBuilder::removeState(IntPair duplStates) {
    const int32_t keepState = duplStates.first;
    const int32_t duplState = duplStates.second;
    U_ASSERT(keepState < duplState);
    U_ASSERT(duplState < fDStates->size());

    RBBIStateDescriptor *duplSD = (RBBIStateDescriptor *)fDStates->elementAt(duplState);
    fDStates->removeElementAt(duplState);
    delete duplSD;

    int32_t numStates = fDStates->size();
    int32_t numCols = fRB->fSetBuilder->getNumCharCategories();
    for (int32_t state=0; state<numStates; ++state) {
        RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(state);
        for (int32_t col=0; col<numCols; col++) {
            int32_t existingVal = sd->fDtran->elementAti(col);
            int32_t newVal = existingVal;
            if (existingVal == duplState) {
                newVal = keepState;
            } else if (existingVal > duplState) {
                newVal = existingVal - 1;
            }
            sd->fDtran->setElementAt(newVal, col);
        }
        if (sd->fAccepting == duplState) {
            sd->fAccepting = keepState;
        } else if (sd->fAccepting > duplState) {
            sd->fAccepting--;
        }
        if (sd->fLookAhead == duplState) {
            sd->fLookAhead = keepState;
        } else if (sd->fLookAhead > duplState) {
            sd->fLookAhead--;
        }
    }
}